

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab10.c
# Opt level: O0

int FeederBigParabol(void)

{
  DWORD DVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DWORD DVar5;
  uint uVar6;
  FILE *__stream;
  long lVar7;
  int local_2c;
  long lStack_28;
  int printCount;
  longlong i;
  DWORD t;
  FILE *in;
  
  __stream = fopen("in.txt","w");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    printf("Creating big parabol... ");
    fflush(_stdout);
    DVar1 = GetTickCount();
    fprintf(__stream,"%d\n",100000);
    for (lStack_28 = 1; lStack_28 < 0x61a9; lStack_28 = lStack_28 + 1) {
      local_2c = 0;
      if (bigParabolsN == 1) {
        iVar2 = fprintf(__stream,"%lld %lld\n",lStack_28,lStack_28 * lStack_28 + -0x80000000);
        iVar3 = fprintf(__stream,"%lld %lld\n",-lStack_28,lStack_28 * lStack_28 + -0x80000000);
        lVar7 = lStack_28 + 25000;
        iVar4 = fprintf(__stream,"%lld %lld\n",lVar7,lVar7 * lVar7 + -0x80000000);
        local_2c = fprintf(__stream,"%lld %lld\n",-lVar7,lVar7 * lVar7 + -0x80000000);
        local_2c = local_2c + iVar4 + iVar3 + iVar2;
      }
      else if (bigParabolsN == 2) {
        iVar2 = fprintf(__stream,"%lld %lld\n",lStack_28,-lStack_28 * lStack_28 + 0x7fffffff);
        iVar3 = fprintf(__stream,"%lld %lld\n",-lStack_28,-lStack_28 * lStack_28 + 0x7fffffff);
        lVar7 = lStack_28 + 25000;
        iVar4 = fprintf(__stream,"%lld %lld\n",lVar7,-lVar7 * lVar7 + 0x7fffffff);
        local_2c = fprintf(__stream,"%lld %lld\n",-lVar7,-lVar7 * lVar7 + 0x7fffffff);
        local_2c = local_2c + iVar4 + iVar3 + iVar2;
      }
      else if (bigParabolsN == 3) {
        iVar2 = fprintf(__stream,"%lld %lld\n",lStack_28 * lStack_28 + -0x80000000,lStack_28);
        iVar3 = fprintf(__stream,"%lld %lld\n",lStack_28 * lStack_28 + -0x80000000,-lStack_28);
        lVar7 = lStack_28 + 25000;
        iVar4 = fprintf(__stream,"%lld %lld\n",lVar7 * lVar7 + -0x80000000,lVar7);
        local_2c = fprintf(__stream,"%lld %lld\n",lVar7 * lVar7 + -0x80000000,-lVar7);
        local_2c = local_2c + iVar4 + iVar3 + iVar2;
      }
      else if (bigParabolsN == 4) {
        iVar2 = fprintf(__stream,"%lld %lld\n",lStack_28,lStack_28 * lStack_28);
        iVar3 = fprintf(__stream,"%lld %lld\n",-lStack_28,lStack_28 * lStack_28);
        iVar4 = fprintf(__stream,"%lld %lld\n",lStack_28,-lStack_28 * lStack_28);
        local_2c = fprintf(__stream,"%lld %lld\n",-lStack_28,-lStack_28 * lStack_28);
        local_2c = local_2c + iVar4 + iVar3 + iVar2;
      }
      if (local_2c < 4) {
        fclose(__stream);
        printf("can\'t create in.txt. No space on disk?\n");
        return -1;
      }
    }
    DVar5 = GetTickCount();
    uVar6 = RoundUptoThousand(DVar5 - DVar1);
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ",(ulong)uVar6 / 1000,
           (ulong)uVar6 % 1000);
    LabTimeout = uVar6 * 2 + 2000;
    LabMemoryLimit = 0x649f00;
    fflush(_stdout);
    fclose(__stream);
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int FeederBigParabol(void)
{
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }

    printf("Creating big parabol... ");
    fflush(stdout);
    DWORD t = GetTickCount();
    fprintf(in, "%d\n", MAX_POINT_COUNT);

    for (long long i = 1; i <= MAX_POINT_COUNT / 4; ++i) {
        int printCount = 0;
        if (bigParabolsN == 1) {
            printCount += fprintf(in, "%lld %lld\n", i, i*i + INT_MIN);
            printCount += fprintf(in, "%lld %lld\n", -i, i*i + INT_MIN);
            i += MAX_POINT_COUNT / 4;
            printCount += fprintf(in, "%lld %lld\n", i, i*i + INT_MIN);
            printCount += fprintf(in, "%lld %lld\n", -i, i*i + INT_MIN);
            i -= MAX_POINT_COUNT / 4;
        }
        else if (bigParabolsN == 2) {
            printCount += fprintf(in, "%lld %lld\n", i, -i*i + INT_MAX);
            printCount += fprintf(in, "%lld %lld\n", -i, -i*i + INT_MAX);
            i += MAX_POINT_COUNT / 4;
            printCount += fprintf(in, "%lld %lld\n", i, -i*i + INT_MAX);
            printCount += fprintf(in, "%lld %lld\n", -i, -i*i + INT_MAX);
            i -= MAX_POINT_COUNT / 4;
        }
        else if (bigParabolsN == 3) {
            printCount += fprintf(in, "%lld %lld\n", i*i + INT_MIN, i);
            printCount += fprintf(in, "%lld %lld\n", i*i + INT_MIN, -i);
            i += MAX_POINT_COUNT / 4;
            printCount += fprintf(in, "%lld %lld\n", i*i + INT_MIN, i);
            printCount += fprintf(in, "%lld %lld\n", i*i + INT_MIN, -i);
            i -= MAX_POINT_COUNT / 4;
        }
        else if (bigParabolsN == 4) {
            printCount += fprintf(in, "%lld %lld\n", i, i*i);
            printCount += fprintf(in, "%lld %lld\n", -i, i*i);
            printCount += fprintf(in, "%lld %lld\n", i, -i*i);
            printCount += fprintf(in, "%lld %lld\n", -i, -i*i);
        }

        if (printCount < 4) {
            fclose(in);
            printf("can't create in.txt. No space on disk?\n");
            return -1;
        }
    }

    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 2*T+2... ", (unsigned)t/1000);
    LabTimeout = (int)t*2+2000;
    LabMemoryLimit = MIN_PROCESS_RSS_BYTES + 3*sizeof(TPoint)*MAX_POINT_COUNT;
    fflush(stdout);
    fclose(in);

    return 0;    
}